

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::values::standard_value<bool>::set_default_and_implicit(standard_value<bool> *this)

{
  (this->super_abstract_value<bool>).m_default = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_abstract_value<bool>).m_default_value,0,
             (char *)(this->super_abstract_value<bool>).m_default_value._M_string_length,0x1ffa16);
  (this->super_abstract_value<bool>).m_implicit = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_abstract_value<bool>).m_implicit_value,0,
             (char *)(this->super_abstract_value<bool>).m_implicit_value._M_string_length,0x200b98);
  return;
}

Assistant:

void
  set_default_and_implicit()
  {
    m_default = true;
    m_default_value = "false";
    m_implicit = true;
    m_implicit_value = "true";
  }